

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd_array.cpp
# Opt level: O2

void __thiscall NshCmdArrayInit_Success_Test::TestBody(NshCmdArrayInit_Success_Test *this)

{
  uint *matchers_1;
  FieldsAreMatcher<std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *matcher;
  EachMatcher<testing::internal::FieldsAreMatcher<std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *matcher_00;
  char *pcVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  AssertionResult gtest_ar_2;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  AssertionResult gtest_ar;
  nsh_status_t status;
  undefined8 local_388;
  FieldsAreMatcher<std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_380;
  EachMatcher<testing::internal::FieldsAreMatcher<std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_350;
  nsh_cmd_array_t cmds;
  
  status = nsh_cmd_array_init(&cmds);
  local_3e8.impl_.string_._M_dataplus._M_p._0_4_ = 0;
  testing::internal::CmpHelperEQ<nsh_status,nsh_status>
            ((internal *)&gtest_ar,"status","NSH_STATUS_OK",&status,(nsh_status *)&local_3e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
               ,0x16,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3e8);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    matchers_1 = &cmds.count;
    local_3e8.impl_.string_._M_dataplus._M_p._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&gtest_ar,"cmds.count","0",matchers_1,(int *)&local_3e8);
    if (gtest_ar.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      local_388 = 0;
      pcVar1 = "";
      testing::StrEq<char[1]>(&local_3e8,(StringLike<char[1]> *)0x143098);
      testing::no_adl::
      FieldsAre<decltype(nullptr),testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>>
                (&local_380,(no_adl *)&local_388,(void **)&local_3e8,
                 (PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)matchers_1);
      testing::
      Each<testing::internal::FieldsAreMatcher<decltype(nullptr),testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>>>
                (&local_350,(testing *)&local_380,matcher);
      testing::internal::
      MakePredicateFormatterFromMatcher<testing::internal::EachMatcher<testing::internal::FieldsAreMatcher<decltype(nullptr),testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>>>>
                ((PredicateFormatterFromMatcher<testing::internal::EachMatcher<testing::internal::FieldsAreMatcher<std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)&gtest_ar,(internal *)&local_350,matcher_00);
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::EachMatcher<testing::internal::FieldsAreMatcher<decltype(nullptr),testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>>>>
      ::operator()(&gtest_ar_2,&gtest_ar.success_,(nsh_cmd (*) [32])"cmds.array");
      std::__cxx11::string::~string((string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_3e8);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_3e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                   ,0x18,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_3e8,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3e8);
        if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
        }
      }
      this_00 = &gtest_ar_2.message_;
      goto LAB_00113fc1;
    }
    testing::Message::Message((Message *)&local_3e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
               ,0x17,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_3e8);
  }
  this_00 = &gtest_ar.message_;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
  if ((long *)CONCAT44(local_3e8.impl_.string_._M_dataplus._M_p._4_4_,
                       local_3e8.impl_.string_._M_dataplus._M_p._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_3e8.impl_.string_._M_dataplus._M_p._4_4_,
                                   local_3e8.impl_.string_._M_dataplus._M_p._0_4_) + 8))();
  }
LAB_00113fc1:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  return;
}

Assistant:

TEST(NshCmdArrayInit, Success)
{
    nsh_cmd_array_t cmds;

    auto status = nsh_cmd_array_init(&cmds);

    ASSERT_EQ(status, NSH_STATUS_OK);
    ASSERT_EQ(cmds.count, 0);
    ASSERT_THAT(cmds.array, Each(FieldsAre(nullptr, StrEq(""))));
}